

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

float dxx(qnode_ptr_t q,int x,int y,int z)

{
  int iVar1;
  param512_t *papVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  float *pfVar6;
  kernel_t *pkVar7;
  int iVar8;
  float fVar9;
  
  iVar3 = C.m / 2;
  iVar8 = iVar3 * 2 + q->ofst;
  iVar1 = q->res;
  papVar2 = q->param_ptr[z];
  piVar5 = &(*papVar2)[iVar1 * x + y].err;
  if ((((iVar8 <= y) && (iVar8 <= x)) && (x < q->sizy - iVar8)) && (y < q->sizx - iVar8)) {
    *piVar5 = 0;
    pfVar6 = &(*papVar2)[((long)x - (long)iVar3) * (long)iVar1 + (long)y].fx;
    fVar9 = 0.0;
    pkVar7 = &C;
    for (lVar4 = (long)-iVar3; lVar4 <= iVar3; lVar4 = lVar4 + 1) {
      fVar9 = fVar9 + *pfVar6 * pkVar7->k[0];
      pfVar6 = pfVar6 + (long)iVar1 * 8;
      pkVar7 = (kernel_t *)(pkVar7->k + 1);
    }
    return fVar9 / C.f;
  }
  *piVar5 = 1;
  return 0.0;
}

Assistant:

float dxx(q,x,y,z)
qnode_ptr_t q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,q->sizy,q->sizx,q->ofst,h,2)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[q->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*q->param_ptr[z])[q->res*(x+i) + y].fx*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}